

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

Hop_Obj_t * Hop_Remap(Hop_Man_t *p,Hop_Obj_t *pRoot,uint uSupp,int nVars)

{
  undefined8 *puVar1;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pObj;
  int i;
  ulong uVar4;
  
  if (p->nObjs[2] < nVars) {
    pRoot = (Hop_Obj_t *)0x0;
    printf("Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n",nVars);
  }
  else {
    pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    if ((*(uint *)&pObj->field_0x20 & 7) != 1) {
      if (uSupp == 0) {
        if (((ulong)pRoot & 1) == 0) {
          uVar4 = (ulong)(*(uint *)&pRoot->field_0x20 >> 3 & 1);
        }
        else {
          uVar4 = (ulong)((*(uint *)&pObj->field_0x20 & 8) == 0);
        }
        pRoot = (Hop_Obj_t *)((ulong)p->pConst1 ^ uVar4 ^ 1);
      }
      else {
        pVVar2 = p->vPis;
        if (pVVar2->nSize < 1) {
          i = 0;
        }
        else {
          uVar4 = 0;
          i = 0;
          do {
            if ((uint)nVars == uVar4) break;
            puVar1 = (undefined8 *)pVVar2->pArray[uVar4];
            if ((uSupp >> ((uint)uVar4 & 0x1f) & 1) == 0) {
              pHVar3 = (Hop_Obj_t *)((ulong)p->pConst1 ^ 1);
            }
            else {
              pHVar3 = Hop_IthVar(p,i);
              i = i + 1;
            }
            *puVar1 = pHVar3;
            uVar4 = uVar4 + 1;
            pVVar2 = p->vPis;
          } while ((long)uVar4 < (long)pVVar2->nSize);
        }
        if ((i < 1) || (nVars <= i)) {
          __assert_fail("k > 0 && k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                        ,0x220,"Hop_Obj_t *Hop_Remap(Hop_Man_t *, Hop_Obj_t *, unsigned int, int)");
        }
        Hop_Remap_rec(p,pObj);
        Hop_ConeUnmark_rec(pObj);
        pRoot = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
      }
    }
  }
  return pRoot;
}

Assistant:

Hop_Obj_t * Hop_Remap( Hop_Man_t * p, Hop_Obj_t * pRoot, unsigned uSupp, int nVars )
{
    Hop_Obj_t * pObj;
    int i, k;
    // quit if the PI variable is not defined
    if ( nVars > Hop_ManPiNum(p) )
    {
        printf( "Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n", nVars, Hop_ManPiNum(p) );
        return NULL;
    }
    // return if constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return pRoot;
    if ( uSupp == 0 )
        return Hop_NotCond( Hop_ManConst0(p), Hop_ObjPhaseCompl(pRoot) );
    // set the PI mapping
    k = 0;
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( i == nVars )
           break;
        if ( uSupp & (1 << i) )
            pObj->pData = Hop_IthVar(p, k++);
        else
            pObj->pData = Hop_ManConst0(p);
    }
    assert( k > 0 && k < nVars );
    // recursively perform composition
    Hop_Remap_rec( p, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}